

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

connectdata * cpool_get_oldest_idle(cpool *cpool)

{
  undefined8 uVar1;
  undefined4 uVar2;
  Curl_hash_element *pCVar3;
  Curl_llist_node *n;
  connectdata *pcVar4;
  size_t sVar5;
  timediff_t tVar6;
  connectdata *pcVar7;
  long lVar8;
  curltime cVar9;
  curltime older;
  curltime newer;
  Curl_hash_iterator iter;
  Curl_hash_iterator CStack_48;
  
  cVar9 = Curl_now();
  Curl_hash_start_iterate(&cpool->dest2bundle,&CStack_48);
  pCVar3 = Curl_hash_next_element(&CStack_48);
  if (pCVar3 == (Curl_hash_element *)0x0) {
    pcVar7 = (connectdata *)0x0;
  }
  else {
    lVar8 = -1;
    pcVar7 = (connectdata *)0x0;
    do {
      for (n = Curl_llist_head((Curl_llist *)pCVar3->ptr); n != (Curl_llist_node *)0x0;
          n = Curl_node_next(n)) {
        pcVar4 = (connectdata *)Curl_node_elem(n);
        sVar5 = Curl_llist_count(&pcVar4->easyq);
        if ((((sVar5 == 0) && (((ulong)pcVar4->bits & 0x20) == 0)) && (pcVar4->connect_only == '\0')
            ) && (uVar1 = (pcVar4->lastused).tv_sec, uVar2 = (pcVar4->lastused).tv_usec,
                 older.tv_usec = uVar2, older.tv_sec = uVar1, older._12_4_ = 0, newer._12_4_ = 0,
                 newer.tv_sec = SUB128(cVar9._0_12_,0), newer.tv_usec = SUB124(cVar9._0_12_,8),
                 tVar6 = Curl_timediff(newer,older), lVar8 < tVar6)) {
          pcVar7 = pcVar4;
          lVar8 = tVar6;
        }
      }
      pCVar3 = Curl_hash_next_element(&CStack_48);
    } while (pCVar3 != (Curl_hash_element *)0x0);
  }
  return pcVar7;
}

Assistant:

static struct connectdata *cpool_get_oldest_idle(struct cpool *cpool)
{
  struct Curl_hash_iterator iter;
  struct Curl_llist_node *curr;
  struct Curl_hash_element *he;
  struct connectdata *oldest_idle = NULL;
  struct cpool_bundle *bundle;
  struct curltime now;
  timediff_t highscore =- 1;
  timediff_t score;

  now = Curl_now();
  Curl_hash_start_iterate(&cpool->dest2bundle, &iter);

  for(he = Curl_hash_next_element(&iter); he;
      he = Curl_hash_next_element(&iter)) {
    struct connectdata *conn;
    bundle = he->ptr;

    for(curr = Curl_llist_head(&bundle->conns); curr;
        curr = Curl_node_next(curr)) {
      conn = Curl_node_elem(curr);
      if(CONN_INUSE(conn) || conn->bits.close || conn->connect_only)
        continue;
      /* Set higher score for the age passed since the connection was used */
      score = Curl_timediff(now, conn->lastused);
      if(score > highscore) {
        highscore = score;
        oldest_idle = conn;
      }
    }
  }
  return oldest_idle;
}